

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O3

uchar * convert_image_to_DXT5(uchar *uncompressed,int width,int height,int channels,int *out_size)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uchar *puVar5;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  uchar cblock [8];
  uchar ublock [64];
  int local_10c;
  undefined8 local_108;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined8 local_c8;
  uchar *local_c0;
  undefined8 local_b8;
  long local_b0;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  long local_80;
  uchar local_78 [72];
  
  local_b8 = CONCAT44(in_register_00000034,width);
  local_c8 = CONCAT44(in_register_00000014,height);
  *out_size = 0;
  if (channels - 5U < 0xfffffffc || (uncompressed == (uchar *)0x0 || (height < 1 || width < 1))) {
    local_c0 = (uchar *)0x0;
  }
  else {
    bVar17 = 2 < (uint)channels;
    uVar4 = (ulong)bVar17;
    bVar1 = (byte)channels & 1;
    uVar8 = (width * 4 + 0xcU & 0xfffffff0) * (height + 3U >> 2);
    *out_size = uVar8;
    local_c0 = (uchar *)malloc((ulong)uVar8);
    uVar6 = 0;
    uVar8 = channels * (int)local_b8;
    local_88 = (ulong)uVar8;
    local_fc = uVar8 * 4;
    local_ec = channels * 4;
    local_e4 = (uint)bVar17 + (uint)bVar17;
    local_100 = (int)local_b8 + -1;
    local_b0 = 0;
    local_90 = 0;
    local_dc = channels;
    do {
      local_f0 = (int)local_c8 - (int)local_b0;
      local_b0 = local_b0 + 4;
      iVar11 = local_f0;
      if ((int)local_b0 < (int)local_c8) {
        iVar11 = 4;
      }
      local_80 = (long)iVar11;
      local_10c = local_100;
      local_98 = 0;
      local_f8 = local_dc;
      local_f4 = local_e4;
      local_a8 = uVar4;
      local_a0 = uVar6;
      do {
        local_e0 = (int)uVar4;
        local_e8 = (int)uVar6;
        iVar3 = local_f0;
        if (iVar11 < 1) {
          iVar2 = 0;
LAB_00151c8d:
          do {
            lVar7 = (long)iVar2;
            lVar9 = 0;
            do {
              local_78[lVar9 + lVar7] = local_78[0];
              local_78[lVar9 + lVar7 + 1] = local_78[1];
              local_78[lVar9 + lVar7 + 2] = local_78[2];
              local_78[lVar9 + lVar7 + 3] = local_78[3];
              lVar9 = lVar9 + 4;
            } while ((int)lVar9 != 0x10);
            iVar2 = iVar2 + 0x10;
            bVar17 = iVar3 < 3;
            iVar3 = iVar3 + 1;
          } while (bVar17);
        }
        else {
          local_d8 = (int)local_b8 - (int)local_98;
          if ((int)(local_98 + 4) < (int)local_b8) {
            local_d8 = 4;
          }
          lVar7 = 0;
          iVar2 = 0;
          iVar10 = local_e4;
          iVar16 = local_dc;
          do {
            local_cc = iVar10;
            iVar13 = (int)uVar4;
            iVar10 = (int)uVar6;
            if (local_d8 < 1) {
LAB_00151c05:
              puVar5 = local_78 + (long)iVar2 + 3;
              iVar14 = local_10c;
              do {
                puVar5[-3] = local_78[0];
                puVar5[-2] = local_78[1];
                puVar5[-1] = local_78[2];
                *puVar5 = local_78[3];
                puVar5 = puVar5 + 4;
                iVar2 = iVar2 + 4;
                iVar14 = iVar14 + 1;
              } while (iVar14 < 3);
            }
            else {
              lVar12 = (long)iVar2;
              lVar9 = 0;
              iVar14 = local_cc;
              iVar15 = iVar16;
              do {
                local_78[lVar9 * 4 + lVar12] = uncompressed[(int)uVar6];
                local_78[lVar9 * 4 + lVar12 + 1] = uncompressed[(int)uVar4];
                local_78[lVar9 * 4 + lVar12 + 2] = uncompressed[iVar14];
                local_78[lVar9 * 4 + lVar12 + 3] =
                     uncompressed[(long)iVar15 + -1] * (bVar1 ^ 1) - bVar1;
                lVar9 = lVar9 + 1;
                uVar6 = (ulong)(uint)((int)uVar6 + channels);
                iVar14 = iVar14 + channels;
                uVar4 = (ulong)(uint)((int)uVar4 + channels);
                iVar15 = iVar15 + channels;
                iVar2 = iVar2 + 4;
              } while (lVar9 < local_d8);
              local_d4 = iVar13;
              local_d0 = iVar16;
              if (local_d8 < 4) goto LAB_00151c05;
            }
            lVar7 = lVar7 + 1;
            iVar14 = (int)local_88;
            uVar6 = (ulong)(uint)(iVar10 + iVar14);
            uVar4 = (ulong)(uint)(iVar13 + iVar14);
            iVar16 = iVar16 + iVar14;
            iVar10 = local_cc + iVar14;
          } while (lVar7 < local_80);
          if (iVar11 < 4) goto LAB_00151c8d;
        }
        local_98 = local_98 + 4;
        compress_DDS_alpha_block(local_78,(uchar *)&local_108);
        puVar5 = local_c0;
        iVar3 = (int)local_90;
        *(undefined8 *)(local_c0 + (int)local_90) = local_108;
        compress_DDS_color_block(4,local_78,(uchar *)&local_108);
        *(undefined8 *)(puVar5 + (iVar3 + 8)) = local_108;
        local_90 = (long)(iVar3 + 8) + 8;
        uVar6 = (ulong)(uint)(local_e8 + local_ec);
        local_e4 = local_e4 + local_ec;
        uVar4 = (ulong)(uint)(local_e0 + local_ec);
        local_dc = local_dc + local_ec;
        local_10c = local_10c + -4;
      } while ((int)local_98 < (int)local_b8);
      uVar6 = (ulong)(uint)((int)local_a0 + local_fc);
      local_e4 = local_f4 + local_fc;
      uVar4 = (ulong)(uint)((int)local_a8 + local_fc);
      local_dc = local_f8 + local_fc;
    } while ((int)local_b0 < (int)local_c8);
  }
  return local_c0;
}

Assistant:

unsigned char* convert_image_to_DXT5(
		const unsigned char *const uncompressed,
		int width, int height, int channels,
		int *out_size )
{
	unsigned char *compressed;
	int i, j, x, y;
	unsigned char ublock[16*4];
	unsigned char cblock[8];
	int index = 0, chan_step = 1;
	int block_count = 0, has_alpha;
	/*	error check	*/
	*out_size = 0;
	if( (width < 1) || (height < 1) ||
		(NULL == uncompressed) ||
		(channels < 1) || ( channels > 4) )
	{
		return NULL;
	}
	/*	for channels == 1 or 2, I do not step forward for R,G,B vales	*/
	if( channels < 3 )
	{
		chan_step = 0;
	}
	/*	# channels = 1 or 3 have no alpha, 2 & 4 do have alpha	*/
	has_alpha = 1 - (channels & 1);
	/*	get the RAM for the compressed image
		(16 bytes per 4x4 pixel block)	*/
	*out_size = ((width+3) >> 2) * ((height+3) >> 2) * 16;
	compressed = (unsigned char*)malloc( *out_size );
	/*	go through each block	*/
	for( j = 0; j < height; j += 4 )
	{
		for( i = 0; i < width; i += 4 )
		{
			/*	local variables, and my block counter	*/
			int idx = 0;
			int mx = 4, my = 4;
			if( j+4 >= height )
			{
				my = height - j;
			}
			if( i+4 >= width )
			{
				mx = width - i;
			}
			for( y = 0; y < my; ++y )
			{
				for( x = 0; x < mx; ++x )
				{
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels];
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels+chan_step];
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels+chan_step+chan_step];
					ublock[idx++] =
						has_alpha * uncompressed[(j+y)*width*channels+(i+x)*channels+channels-1]
						+ (1-has_alpha)*255;
				}
				for( x = mx; x < 4; ++x )
				{
					ublock[idx++] = ublock[0];
					ublock[idx++] = ublock[1];
					ublock[idx++] = ublock[2];
					ublock[idx++] = ublock[3];
				}
			}
			for( y = my; y < 4; ++y )
			{
				for( x = 0; x < 4; ++x )
				{
					ublock[idx++] = ublock[0];
					ublock[idx++] = ublock[1];
					ublock[idx++] = ublock[2];
					ublock[idx++] = ublock[3];
				}
			}
			/*	now compress the alpha block	*/
			compress_DDS_alpha_block( ublock, cblock );
			/*	copy the data from the compressed alpha block into the main buffer	*/
			for( x = 0; x < 8; ++x )
			{
				compressed[index++] = cblock[x];
			}
			/*	then compress the color block	*/
			++block_count;
			compress_DDS_color_block( 4, ublock, cblock );
			/*	copy the data from the compressed color block into the main buffer	*/
			for( x = 0; x < 8; ++x )
			{
				compressed[index++] = cblock[x];
			}
		}
	}
	return compressed;
}